

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

Value * apply_addition_operation(Value *left_value,Value *right_value)

{
  size_t *psVar1;
  ValueType VVar2;
  ValueType VVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  char *__s;
  char *__s_00;
  size_t sVar8;
  size_t sVar9;
  char *__dest;
  Value *pVVar10;
  Value **items;
  size_t sVar11;
  longdouble lVar12;
  longdouble lVar13;
  
  VVar2 = left_value->value_type;
  if ((VVar2 == ValueTypeStringValue) ||
     (VVar3 = right_value->value_type, VVar3 == ValueTypeStringValue)) {
    __s = convert_to_string(left_value);
    __s_00 = convert_to_string(right_value);
    sVar8 = strlen(__s);
    sVar9 = strlen(__s_00);
    __dest = (char *)calloc(sVar9 + sVar8 + 1,1);
    strcpy(__dest,__s);
    strcat(__dest,__s_00);
    free(__s);
    free(__s_00);
    pVVar10 = new_string_value(__dest,sVar9 + sVar8);
    return pVVar10;
  }
  if ((VVar3 & ~ValueTypeBoolValue) != ValueTypeIntegerValue ||
      (VVar2 & ~ValueTypeBoolValue) != ValueTypeIntegerValue) {
    if ((VVar3 - ValueTypeTupleValue | VVar2 - ValueTypeTupleValue) < 2) {
      lVar4 = *(long *)(left_value + 1);
      sVar5 = left_value[1].linked_variable_count;
      lVar6 = *(long *)(right_value + 1);
      sVar7 = right_value[1].linked_variable_count;
      items = (Value **)malloc((sVar7 + sVar5) * 8);
      if (sVar5 != 0) {
        sVar11 = 0;
        do {
          pVVar10 = *(Value **)(lVar4 + sVar11 * 8);
          items[sVar11] = pVVar10;
          psVar1 = &pVVar10->linked_variable_count;
          *psVar1 = *psVar1 + 1;
          sVar11 = sVar11 + 1;
        } while (sVar5 != sVar11);
      }
      if (sVar7 != 0) {
        sVar11 = 0;
        do {
          pVVar10 = *(Value **)(lVar6 + sVar11 * 8);
          items[sVar5 + sVar11] = pVVar10;
          psVar1 = &pVVar10->linked_variable_count;
          *psVar1 = *psVar1 + 1;
          sVar11 = sVar11 + 1;
        } while (sVar7 != sVar11);
      }
      pVVar10 = new_list_value(items,sVar7 + sVar5,true);
      return pVVar10;
    }
    pVVar10 = new_null_value();
    return pVVar10;
  }
  if (VVar3 == ValueTypeIntegerValue && VVar2 == ValueTypeIntegerValue) {
    pVVar10 = new_integer_value(*(long *)(right_value + 1) + *(long *)(left_value + 1));
    return pVVar10;
  }
  if (VVar2 == ValueTypeFloatValue) {
    lVar12 = *(longdouble *)&left_value[1].linked_variable_count;
  }
  else {
    lVar12 = (longdouble)*(long *)(left_value + 1);
  }
  if (VVar3 == ValueTypeFloatValue) {
    lVar13 = *(longdouble *)&right_value[1].linked_variable_count;
  }
  else {
    lVar13 = (longdouble)*(long *)(right_value + 1);
  }
  pVVar10 = new_float_value(lVar13 + lVar12);
  return pVVar10;
}

Assistant:

Value *apply_addition_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeStringValue || right_value->value_type == ValueTypeStringValue) {
    char *s1 = convert_to_string(left_value);
    char *s2 = convert_to_string(right_value);

    size_t length = strlen(s1) + strlen(s2);

    char *result_string = calloc(length + 1, sizeof(char));

    strcpy(result_string, s1);
    strcat(result_string, s2);

    free(s1);
    free(s2);

    return new_string_value(result_string, length);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
      return new_integer_value(((IntegerValue *) left_value)->integer_value + ((IntegerValue *) right_value)->integer_value);
    }
    else {
      long double left_float, right_float;

      if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
      else left_float = ((IntegerValue *) left_value)->integer_value;

      if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
      else right_float = ((IntegerValue *) right_value)->integer_value;

      return new_float_value(left_float + right_float);
    }
  }
  else if ((left_value->value_type == ValueTypeTupleValue || left_value->value_type == ValueTypeListValue) && (right_value->value_type == ValueTypeTupleValue || right_value->value_type == ValueTypeListValue)) {
    Value **left_array_items, **right_array_items, **result_items;
    size_t left_array_item_length, right_array_item_length;

    if (left_value->value_type == ValueTypeListValue) {
      left_array_items = ((ListValue *) left_value)->items;
      left_array_item_length = ((ListValue *) left_value)->length;
    }
    else {
      left_array_items = ((TupleValue *) left_value)->items;
      left_array_item_length = ((TupleValue *) left_value)->length;
    }

    if (right_value->value_type == ValueTypeListValue) {
      right_array_items = ((ListValue *) right_value)->items;
      right_array_item_length = ((ListValue *) right_value)->length;
    }
    else {
      right_array_items = ((TupleValue *) right_value)->items;
      right_array_item_length = ((TupleValue *) right_value)->length;
    }

    result_items = malloc((left_array_item_length + right_array_item_length) * sizeof(Value *));

    for (int i = 0; i < left_array_item_length; i++) {
      result_items[i] = left_array_items[i];
      result_items[i]->linked_variable_count++;
    }

    for (int i = 0; i < right_array_item_length; i++) {
      result_items[i + left_array_item_length] = right_array_items[i];
      result_items[i + left_array_item_length]->linked_variable_count++;
    }

    return new_list_value(result_items, left_array_item_length + right_array_item_length, true);
  }

  return new_null_value();
}